

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall el::base::Storage::setApplicationArguments(Storage *this,int argc,char **argv)

{
  CommandLineArgs *this_00;
  RegisteredLoggers *pRVar1;
  bool bVar2;
  int iVar3;
  EnumType EVar4;
  char *pcVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Configurations c;
  allocator local_91;
  string local_90;
  Configurations local_70;
  undefined8 *puVar6;
  
  this_00 = &this->m_commandLineArgs;
  utils::CommandLineArgs::setArgs(this_00,argc,argv);
  VRegistry::setFromArgs(this->m_vRegistry,this_00);
  bVar2 = utils::CommandLineArgs::hasParamWithValue(this_00,"--default-log-file");
  if (bVar2) {
    local_70.m_configurationFile._M_dataplus._M_p = (pointer)&local_70.m_configurationFile.field_2;
    local_70.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .m_list = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>)0x0;
    local_70.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._17_7_ = 0;
    local_70.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._24_8_ = 0;
    local_70.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ._32_8_ = 0;
    local_70.super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>.
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00192ab0;
    local_70.m_configurationFile._M_string_length = 0;
    local_70.m_configurationFile.field_2._M_local_buf[0] = '\0';
    local_70.m_isFromFile = false;
    pcVar5 = utils::CommandLineArgs::getParamValue(this_00,"--default-log-file");
    std::__cxx11::string::string((string *)&local_90,pcVar5,&local_91);
    Configurations::setGlobally(&local_70,Filename,&local_90,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pRVar1 = this->m_registeredLoggers;
    (*(pRVar1->
      super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).
      super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[2])(pRVar1);
    Configurations::setFromBase(&pRVar1->m_defaultConfigurations,&local_70);
    iVar3 = (*(this->m_registeredLoggers->
              super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[5])();
    puVar6 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    while( true ) {
      iVar3 = (*(this->m_registeredLoggers->
                super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).
                super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[6])();
      if (puVar6 == (undefined8 *)CONCAT44(extraout_var_00,iVar3)) break;
      Logger::configure((Logger *)puVar6[5],&local_70);
      puVar6 = (undefined8 *)*puVar6;
    }
    Configurations::~Configurations(&local_70);
  }
  bVar2 = utils::CommandLineArgs::hasParamWithValue(this_00,"--logging-flags");
  if (bVar2) {
    pcVar5 = utils::CommandLineArgs::getParamValue(this_00,"--logging-flags");
    EVar4 = atoi(pcVar5);
    this->m_flags = EVar4;
  }
  return;
}

Assistant:

void Storage::setApplicationArguments(int argc, char** argv) {
  m_commandLineArgs.setArgs(argc, argv);
  m_vRegistry->setFromArgs(commandLineArgs());
  // default log file
#if !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kDefaultLogFileParam)) {
    Configurations c;
    c.setGlobally(ConfigurationType::Filename,
                  std::string(m_commandLineArgs.getParamValue(base::consts::kDefaultLogFileParam)));
    registeredLoggers()->setDefaultConfigurations(c);
    for (base::RegisteredLoggers::iterator it = registeredLoggers()->begin();
         it != registeredLoggers()->end(); ++it) {
      it->second->configure(c);
    }
  }
#endif  // !defined(ELPP_DISABLE_LOG_FILE_FROM_ARG)
#if defined(ELPP_LOGGING_FLAGS_FROM_ARG)
  if (m_commandLineArgs.hasParamWithValue(base::consts::kLoggingFlagsParam)) {
    int userInput = atoi(m_commandLineArgs.getParamValue(base::consts::kLoggingFlagsParam));
    if (ELPP_DEFAULT_LOGGING_FLAGS == 0x0) {
      m_flags = userInput;
    } else {
      base::utils::addFlag<base::type::EnumType>(userInput, &m_flags);
    }
  }
#endif  // defined(ELPP_LOGGING_FLAGS_FROM_ARG)
}